

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O2

int Aig_TableCountEntries(Aig_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  Aig_Obj_t *pAVar4;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nTableSize;
  if (p->nTableSize < 1) {
    uVar2 = uVar3;
  }
  iVar1 = 0;
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    pAVar4 = (Aig_Obj_t *)(p->pTable + uVar3);
    iVar1 = iVar1 + -1;
    do {
      pAVar4 = *(Aig_Obj_t **)&pAVar4->field_0;
      iVar1 = iVar1 + 1;
    } while (pAVar4 != (Aig_Obj_t *)0x0);
  }
  return iVar1;
}

Assistant:

int Aig_TableCountEntries( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry;
    int i, Counter = 0;
    for ( i = 0; i < p->nTableSize; i++ )
        for ( pEntry = p->pTable[i]; pEntry; pEntry = pEntry->pNext )
            Counter++;
    return Counter;
}